

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O1

Interaction * __thiscall
phyr::Sphere::sample
          (Interaction *__return_storage_ptr__,Sphere *this,Interaction *ref,Point2f *u,double *pdf)

{
  Transform *pTVar1;
  undefined8 uVar2;
  int i;
  int iVar3;
  uint uVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double extraout_XMM0_Qb;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  Point3f op;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double local_c8 [4];
  double local_a8;
  double dStack_a0;
  double local_98 [4];
  double local_78;
  double local_68;
  double dStack_60;
  undefined1 local_58 [24];
  double local_40;
  undefined1 local_38 [16];
  
  pTVar1 = (this->super_Shape).localToWorld;
  dVar8 = (pTVar1->mat).d[0][2] * 0.0 + (pTVar1->mat).d[0][0] * 0.0 + (pTVar1->mat).d[0][1] * 0.0 +
          (pTVar1->mat).d[0][3];
  dVar14 = (pTVar1->mat).d[3][2] * 0.0 + (pTVar1->mat).d[3][0] * 0.0 + (pTVar1->mat).d[3][1] * 0.0 +
           (pTVar1->mat).d[3][3];
  uVar4 = -(uint)(dVar14 == 1.0) & 1;
  dVar13 = 1.0 / dVar14;
  dVar15 = dVar8 * dVar13;
  if ((dVar14 == 1.0) && (!NAN(dVar14))) {
    dVar15 = dVar8;
  }
  dVar8 = (ref->p).x;
  dVar16 = dVar15 - dVar8;
  dVar14 = (pTVar1->mat).d[1][2] * 0.0 + (pTVar1->mat).d[1][0] * 0.0 + (pTVar1->mat).d[1][1] * 0.0 +
           (pTVar1->mat).d[1][3];
  dVar7 = (pTVar1->mat).d[2][2] * 0.0 + (pTVar1->mat).d[2][0] * 0.0 + (pTVar1->mat).d[2][1] * 0.0 +
          (pTVar1->mat).d[2][3];
  auVar17._0_8_ = CONCAT44((int)(uVar4 << 0x1f) >> 0x1f,(int)(uVar4 << 0x1f) >> 0x1f);
  auVar17._8_4_ = (int)(uVar4 << 0x1f) >> 0x1f;
  auVar17._12_4_ = (int)(uVar4 << 0x1f) >> 0x1f;
  dVar10 = (double)(~auVar17._0_8_ & (ulong)(dVar13 * dVar14) | (ulong)dVar14 & auVar17._0_8_);
  dVar12 = (double)(~auVar17._8_8_ & (ulong)(dVar13 * dVar7) | (ulong)dVar7 & auVar17._8_8_);
  dVar14 = (ref->p).y;
  dVar7 = (ref->p).z;
  dVar18 = dVar10 - dVar14;
  dVar19 = dVar12 - dVar7;
  dVar13 = (ref->n).z;
  dVar6 = (ref->n).x;
  dVar9 = (ref->n).y;
  dVar11 = (ABS(dVar6) * (ref->pfError).x + ABS(dVar9) * (ref->pfError).y +
           ABS(dVar13) * (ref->pfError).z) * 1024.0;
  local_98[1] = dVar11 * dVar9;
  local_98[0] = dVar11 * dVar6;
  local_98[2] = dVar11 * dVar13;
  if (dVar13 * dVar19 + dVar6 * dVar16 + dVar18 * dVar9 < 0.0) {
    local_98[1] = -local_98[1];
    local_98[0] = -(dVar11 * dVar6);
    local_98[2] = -(dVar11 * dVar13);
  }
  local_c8[0] = dVar8 + local_98[0];
  local_c8[1] = dVar14 + local_98[1];
  local_c8[2] = dVar7 + local_98[2];
  iVar3 = 0;
  dVar8 = local_98[1];
  do {
    lVar5 = 0;
    if (iVar3 != 0) {
      lVar5 = (ulong)(iVar3 != 1) * 8 + 8;
    }
    if (*(double *)((long)local_98 + lVar5) <= 0.0) {
      if (*(double *)((long)local_98 + lVar5) < 0.0) {
        dVar13 = *(double *)((long)local_c8 + lVar5);
        if (-INFINITY < dVar13) {
          dVar8 = 0.0;
          dVar13 = (double)(~-(ulong)(dVar13 == 0.0) & (ulong)dVar13 |
                           -(ulong)(dVar13 == 0.0) & 0x8000000000000000);
          dVar13 = (double)((long)dVar13 + (ulong)(dVar13 <= 0.0) * 2 + -1);
        }
        goto LAB_0010a622;
      }
    }
    else {
      dVar13 = *(double *)((long)local_c8 + lVar5);
      if (dVar13 < INFINITY) {
        dVar13 = (double)(~-(ulong)(dVar13 == 0.0) & (ulong)dVar13);
        dVar13 = (double)((-(ulong)(dVar13 < 0.0) | 1) + (long)dVar13);
      }
LAB_0010a622:
      *(double *)((long)local_c8 + lVar5) = dVar13;
    }
    iVar3 = iVar3 + 1;
    if (iVar3 == 3) {
      if ((local_c8[2] - dVar12) * (local_c8[2] - dVar12) +
          (local_c8[0] - dVar15) * (local_c8[0] - dVar15) +
          (local_c8[1] - dVar10) * (local_c8[1] - dVar10) <= this->radius * this->radius) {
        (*(this->super_Shape)._vptr_Shape[7])(__return_storage_ptr__,this,u,pdf);
        dVar13 = (__return_storage_ptr__->p).x - (ref->p).x;
        dVar14 = (__return_storage_ptr__->p).y - (ref->p).y;
        dVar7 = (__return_storage_ptr__->p).z - (ref->p).z;
        dVar8 = dVar7 * dVar7 + dVar13 * dVar13 + dVar14 * dVar14;
        dVar15 = 0.0;
        if ((dVar8 != 0.0) || (NAN(dVar8))) {
          if (dVar8 < 0.0) {
            dVar8 = sqrt(dVar8);
          }
          else {
            dVar8 = SQRT(dVar8);
          }
          dVar6 = (ref->p).x - (__return_storage_ptr__->p).x;
          dVar9 = (ref->p).y - (__return_storage_ptr__->p).y;
          dVar15 = (ref->p).z - (__return_storage_ptr__->p).z;
          dVar8 = 1.0 / dVar8;
          dVar15 = ((dVar15 * dVar15 + dVar6 * dVar6 + dVar9 * dVar9) /
                   ABS((dVar13 * -dVar8 * (__return_storage_ptr__->n).x -
                       dVar14 * dVar8 * (__return_storage_ptr__->n).y) -
                       dVar7 * dVar8 * (__return_storage_ptr__->n).z)) * *pdf;
        }
        if (ABS(dVar15) == INFINITY) {
          dVar15 = 0.0;
        }
      }
      else {
        dVar13 = dVar19 * dVar19 + dVar16 * dVar16 + dVar18 * dVar18;
        if (dVar13 < 0.0) {
          dVar13 = sqrt(dVar13);
        }
        else {
          dVar13 = SQRT(dVar13);
        }
        dVar13 = 1.0 / dVar13;
        dVar16 = dVar16 * dVar13;
        dVar18 = dVar18 * dVar13;
        dVar19 = dVar19 * dVar13;
        local_38._8_4_ = SUB84(dVar19,0);
        local_38._0_8_ = dVar19;
        local_38._12_4_ = (int)((ulong)dVar19 >> 0x20);
        if (ABS(dVar16) <= ABS(dVar18)) {
          dVar13 = dVar18 * dVar18 + dVar19 * dVar19;
          if (dVar13 < 0.0) {
            dVar13 = sqrt(dVar13);
          }
          else {
            dVar13 = SQRT(dVar13);
          }
          dVar13 = 1.0 / dVar13;
          local_e8 = (double)local_38._0_8_ * dVar13;
          local_58._8_8_ = dVar13 * 0.0;
          local_58._0_8_ = -dVar18 * dVar13;
        }
        else {
          dVar13 = dVar16 * dVar16 + dVar19 * dVar19;
          if (dVar13 < 0.0) {
            dVar13 = sqrt(dVar13);
          }
          else {
            dVar13 = SQRT(dVar13);
          }
          dVar13 = 1.0 / dVar13;
          local_e8 = dVar13 * 0.0;
          local_58._8_4_ = SUB84(dVar13 * -dVar19,0);
          local_58._0_8_ = dVar13 * dVar16;
          local_58._12_4_ = (int)((ulong)(dVar13 * -dVar19) >> 0x20);
        }
        dVar13 = (ref->p).x - dVar15;
        dVar14 = (ref->p).y - dVar10;
        dVar7 = (ref->p).z - dVar12;
        local_40 = 1.0 - (this->radius * this->radius) /
                         (dVar7 * dVar7 + dVar13 * dVar13 + dVar14 * dVar14);
        if (local_40 <= 0.0) {
          local_40 = 0.0;
        }
        if (local_40 < 0.0) {
          local_40 = sqrt(local_40);
        }
        else {
          local_40 = SQRT(local_40);
        }
        dVar13 = u->x * local_40 + (1.0 - u->x);
        local_a8 = 1.0 - dVar13 * dVar13;
        if (local_a8 <= 0.0) {
          local_a8 = 0.0;
        }
        if (local_a8 < 0.0) {
          local_a8 = sqrt(local_a8);
        }
        else {
          local_a8 = SQRT(local_a8);
        }
        uVar2 = local_58._8_8_;
        dVar14 = u->y;
        dVar7 = (ref->p).x - dVar15;
        dVar9 = (ref->p).y - dVar10;
        dVar6 = (ref->p).z - dVar12;
        dVar7 = dVar6 * dVar6 + dVar7 * dVar7 + dVar9 * dVar9;
        if (dVar7 < 0.0) {
          dVar7 = sqrt(dVar7);
          dVar8 = extraout_XMM0_Qb;
        }
        else {
          dVar7 = SQRT(dVar7);
        }
        local_68 = dVar7 * dVar7;
        dVar6 = this->radius * this->radius - local_a8 * local_68 * local_a8;
        if (dVar6 <= 0.0) {
          dVar6 = 0.0;
        }
        dStack_60 = dVar8;
        dStack_a0 = dVar16;
        local_a8 = dVar19;
        if (dVar6 < 0.0) {
          local_78 = dVar7;
          dVar6 = sqrt(dVar6);
          dVar7 = local_78;
        }
        else {
          dVar6 = SQRT(dVar6);
        }
        local_f8 = -local_a8;
        dStack_f0 = -dStack_a0;
        dVar14 = (dVar14 + dVar14) * 3.141592653589793;
        dVar6 = dVar13 * dVar7 - dVar6;
        dVar8 = this->radius;
        local_68 = ((local_68 + dVar8 * dVar8) - dVar6 * dVar6) / ((dVar7 + dVar7) * dVar8);
        dVar8 = 1.0 - local_68 * local_68;
        if (dVar8 <= 0.0) {
          dVar8 = 0.0;
        }
        if (dVar8 < 0.0) {
          dVar8 = sqrt(dVar8);
        }
        else {
          dVar8 = SQRT(dVar8);
        }
        local_78 = cos(dVar14);
        local_78 = local_78 * dVar8;
        dVar13 = sin(dVar14);
        dVar13 = dVar13 * dVar8;
        dVar14 = (dVar13 * -(dVar18 * (double)local_58._0_8_ + local_e8 * local_f8) -
                 local_78 * (double)local_58._8_8_) - local_68 * dStack_a0;
        dVar7 = (dVar13 * -(dVar19 * (double)local_58._8_8_ + (double)local_58._0_8_ * dStack_f0) -
                local_78 * local_e8) - local_68 * dVar18;
        dVar13 = (-(dVar16 * local_e8 - (double)uVar2 * dVar18) * dVar13 -
                 (double)local_58._0_8_ * local_78) - (double)local_38._0_8_ * local_68;
        dVar8 = this->radius;
        dVar12 = dVar12 + dVar8 * dVar13;
        (__return_storage_ptr__->p).z = 0.0;
        (__return_storage_ptr__->n).x = 0.0;
        (__return_storage_ptr__->wo).z = 0.0;
        (__return_storage_ptr__->pfError).x = 0.0;
        (__return_storage_ptr__->pfError).y = 0.0;
        (__return_storage_ptr__->pfError).z = 0.0;
        (__return_storage_ptr__->n).y = 0.0;
        (__return_storage_ptr__->n).z = 0.0;
        (__return_storage_ptr__->wo).x = 0.0;
        (__return_storage_ptr__->wo).y = 0.0;
        dVar15 = dVar15 + dVar8 * dVar14;
        dVar10 = dVar10 + dVar8 * dVar7;
        (__return_storage_ptr__->p).x = dVar15;
        (__return_storage_ptr__->p).y = dVar10;
        (__return_storage_ptr__->p).z = dVar12;
        (__return_storage_ptr__->pfError).x = ABS(dVar15) * 5.551115123125786e-16;
        (__return_storage_ptr__->pfError).y = ABS(dVar10) * 5.551115123125786e-16;
        (__return_storage_ptr__->pfError).z = ABS(dVar12) * 5.551115123125786e-16;
        (__return_storage_ptr__->n).x = dVar14;
        (__return_storage_ptr__->n).y = dVar7;
        (__return_storage_ptr__->n).z = dVar13;
        if ((this->super_Shape).reverseNormals == true) {
          (__return_storage_ptr__->n).x = -dVar14;
          (__return_storage_ptr__->n).y = -dVar7;
          (__return_storage_ptr__->n).z = -dVar13;
        }
        dVar15 = 1.0 / ((1.0 - local_40) * 6.283185307179586);
      }
      *pdf = dVar15;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Interaction Sphere::sample(const Interaction& ref, const Point2f& u,
                           Real* pdf) const {
    Point3f pCenter = (*localToWorld)(Point3f(0, 0, 0));

    // Sample uniformly on sphere if $\pt{}$ is inside it
    Point3f pOrigin = offsetRayOrigin(ref.p, ref.n, pCenter - ref.p, ref.pfError);

    if (distanceSquared(pOrigin, pCenter) <= radius * radius) {
        Interaction intr = sample(u, pdf);
        Vector3f wi = intr.p - ref.p;
        if (wi.lengthSquared() == 0) {
            *pdf = 0;
        } else {
            // Convert from area measure returned by Sample() call above to
            // solid angle measure.
            wi = normalize(wi);
            *pdf *= distanceSquared(ref.p, intr.p) / absDot(intr.n, -wi);
        }

        if (std::isinf(*pdf)) *pdf = 0.f;
        return intr;
    }

    // Compute coordinate system for sphere sampling
    Vector3f wc = normalize(pCenter - ref.p);
    Vector3f wcX, wcY;
    coordinateSystem(wc, &wcX, &wcY);

    // Sample sphere uniformly inside subtended cone

    // Compute $\theta$ and $\phi$ values for sample in cone
    Real sinThetaMax2 = radius * radius / distanceSquared(ref.p, pCenter);
    Real cosThetaMax = std::sqrt(std::max((Real)0, 1 - sinThetaMax2));
    Real cosTheta = (1 - u[0]) + u[0] * cosThetaMax;
    Real sinTheta = std::sqrt(std::max((Real)0, 1 - cosTheta * cosTheta));
    Real phi = u[1] * 2 * Pi;

    // Compute angle $\alpha$ from center of sphere to sampled point on surface
    Real dc = distance(ref.p, pCenter);
    Real ds = dc * cosTheta -
               std::sqrt(std::max(
                   (Real)0, radius * radius - dc * dc * sinTheta * sinTheta));
    Real cosAlpha = (dc * dc + radius * radius - ds * ds) / (2 * dc * radius);
    Real sinAlpha = std::sqrt(std::max((Real)0, 1 - cosAlpha * cosAlpha));

    // Compute surface normal and sampled point on sphere
    Vector3f nWorld = sphericalDirection(sinAlpha, cosAlpha, phi, -wcX, -wcY, -wc);
    Point3f pWorld = pCenter + radius * Point3f(nWorld.x, nWorld.y, nWorld.z);

    // Return _Interaction_ for sampled point on sphere
    Interaction it; it.p = pWorld;
    it.pfError = gamma(5) * abs((Vector3f)pWorld);
    it.n = Normal3f(nWorld);
    if (reverseNormals) it.n *= -1;

    // Uniform cone PDF.
    *pdf = 1 / (2 * Pi * (1 - cosThetaMax));

    return it;
}